

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O0

void surv0_sock_fini(void *arg)

{
  surv0_sock *sock;
  void *arg_local;
  
  surv0_ctx_fini((void *)((long)arg + 0x48));
  nni_id_map_fini((nni_id_map *)((long)arg + 0xd0));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x108));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x118));
  nni_mtx_fini((nni_mtx *)((long)arg + 0x20));
  return;
}

Assistant:

static void
surv0_sock_fini(void *arg)
{
	surv0_sock *sock = arg;

	surv0_ctx_fini(&sock->ctx);
	nni_id_map_fini(&sock->surveys);
	nni_pollable_fini(&sock->writable);
	nni_pollable_fini(&sock->readable);
	nni_mtx_fini(&sock->mtx);
}